

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O3

uint16_t udata_getHeaderSize_63(DataHeader *udh)

{
  ushort uVar1;
  ushort uVar2;
  
  if (udh != (DataHeader *)0x0) {
    uVar1 = (udh->dataHeader).headerSize;
    uVar2 = uVar1 << 8 | uVar1 >> 8;
    if ((udh->info).isBigEndian == '\0') {
      uVar2 = uVar1;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

U_CFUNC uint16_t
udata_getHeaderSize(const DataHeader *udh) {
    if(udh==NULL) {
        return 0;
    } else if(udh->info.isBigEndian==U_IS_BIG_ENDIAN) {
        /* same endianness */
        return udh->dataHeader.headerSize;
    } else {
        /* opposite endianness */
        uint16_t x=udh->dataHeader.headerSize;
        return (uint16_t)((x<<8)|(x>>8));
    }
}